

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_hook(lua_State *L,int event,int line,int ftransfer,int ntransfer)

{
  lua_Hook p_Var1;
  CallInfo *pCVar2;
  StkId pSVar3;
  long lVar4;
  undefined1 local_d0 [8];
  lua_Debug ar;
  ptrdiff_t ci_top;
  ptrdiff_t top;
  CallInfo *ci;
  int mask;
  lua_Hook hook;
  int ntransfer_local;
  int ftransfer_local;
  int line_local;
  int event_local;
  lua_State *L_local;
  
  p_Var1 = L->hook;
  if ((p_Var1 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    ci._4_2_ = 8;
    pCVar2 = L->ci;
    pSVar3 = (L->top).p;
    lVar4 = (L->stack).offset;
    ar.i_ci = (CallInfo *)((long)(pCVar2->top).p - (L->stack).offset);
    if (ntransfer != 0) {
      ci._4_2_ = 0x108;
      (pCVar2->u2).transferinfo.ftransfer = (unsigned_short)ftransfer;
      (pCVar2->u2).transferinfo.ntransfer = (unsigned_short)ntransfer;
    }
    if (((pCVar2->callstatus & 2) == 0) && ((L->top).p < (pCVar2->top).p)) {
      L->top = pCVar2->top;
    }
    local_d0._0_4_ = event;
    ar.srclen._0_4_ = line;
    ar.short_src._52_8_ = pCVar2;
    if ((long)(L->stack_last).p - (L->top).offset >> 4 < 0x15) {
      luaD_growstack(L,0x14,1);
    }
    if ((pCVar2->top).p < (StkId)((L->top).offset + 0x140U)) {
      (pCVar2->top).p = (StkId)((L->top).offset + 0x140);
    }
    L->allowhook = '\0';
    pCVar2->callstatus = pCVar2->callstatus | ci._4_2_;
    (*p_Var1)(L,(lua_Debug *)local_d0);
    L->allowhook = '\x01';
    (pCVar2->top).p = (StkId)((long)(L->stack).p + (long)ar.i_ci);
    (L->top).p = (StkId)((long)(L->stack).p + ((long)pSVar3 - lVar4));
    pCVar2->callstatus = pCVar2->callstatus & (ci._4_2_ ^ 0xffff);
  }
  return;
}

Assistant:

void luaD_hook (lua_State *L, int event, int line,
                              int ftransfer, int ntransfer) {
  lua_Hook hook = L->hook;
  if (hook && L->allowhook) {  /* make sure there is a hook */
    int mask = CIST_HOOKED;
    CallInfo *ci = L->ci;
    ptrdiff_t top = savestack(L, L->top.p);  /* preserve original 'top' */
    ptrdiff_t ci_top = savestack(L, ci->top.p);  /* idem for 'ci->top' */
    lua_Debug ar;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = ci;
    if (ntransfer != 0) {
      mask |= CIST_TRAN;  /* 'ci' has transfer information */
      ci->u2.transferinfo.ftransfer = ftransfer;
      ci->u2.transferinfo.ntransfer = ntransfer;
    }
    if (isLua(ci) && L->top.p < ci->top.p)
      L->top.p = ci->top.p;  /* protect entire activation register */
    luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
    if (ci->top.p < L->top.p + LUA_MINSTACK)
      ci->top.p = L->top.p + LUA_MINSTACK;
    L->allowhook = 0;  /* cannot call hooks inside a hook */
    ci->callstatus |= mask;
    lua_unlock(L);
    (*hook)(L, &ar);
    lua_lock(L);
    lua_assert(!L->allowhook);
    L->allowhook = 1;
    ci->top.p = restorestack(L, ci_top);
    L->top.p = restorestack(L, top);
    ci->callstatus &= ~mask;
  }
}